

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O3

bool glu::isSizedFormatColorRenderable
               (RenderContext *renderCtx,ContextInfo *contextInfo,deUint32 sizedFormat)

{
  bool bVar1;
  uint uVar2;
  InternalError *this;
  char *name;
  string local_40;
  
  uVar2 = (*renderCtx->_vptr_RenderContext[2])();
  if ((uVar2 & 0x3ff) != 3) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Context type not supported in query","");
    tcu::InternalError::InternalError(this,&local_40);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  if ((int)sizedFormat < 0x8814) {
    uVar2 = sizedFormat - 0x8229;
    if (0x13 < uVar2) {
LAB_0018a8aa:
      if ((sizedFormat - 0x8051 < 9) && ((0x1e1U >> (sizedFormat - 0x8051 & 0x1f) & 1) != 0)) {
        return true;
      }
      if (sizedFormat - 0x81a5 < 2) {
        return false;
      }
      return false;
    }
    if ((0xfff05U >> (uVar2 & 0x1f) & 1) != 0) {
      return true;
    }
    if ((0x50U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_0018a96d;
    if ((0xa0U >> (uVar2 & 0x1f) & 1) == 0) goto LAB_0018a8aa;
  }
  else {
    if (0x8d47 < (int)sizedFormat) {
      if ((sizedFormat - 0x8d62 < 0x2d) &&
         ((0x104104104001U >> ((ulong)(sizedFormat - 0x8d62) & 0x3f) & 1) != 0)) {
        return true;
      }
      if (sizedFormat == 0x8d48) {
        return false;
      }
      if (sizedFormat != 0x906f) {
        return false;
      }
      return true;
    }
    if ((int)sizedFormat < 0x8c3a) {
      if (sizedFormat != 0x8814) {
        if (sizedFormat != 0x881a) {
          if (sizedFormat != 0x88f0) {
            return false;
          }
          return false;
        }
LAB_0018a96d:
        bVar1 = ContextInfo::isExtensionSupported(contextInfo,"GL_EXT_color_buffer_float");
        if (bVar1) {
          return true;
        }
        name = "GL_EXT_color_buffer_half_float";
        goto LAB_0018a987;
      }
    }
    else {
      if (0x8cab < (int)sizedFormat) {
        if (sizedFormat == 0x8cac) {
          return false;
        }
        if (sizedFormat != 0x8cad) {
          return false;
        }
        return false;
      }
      if (sizedFormat != 0x8c3a) {
        if (sizedFormat != 0x8c43) {
          return false;
        }
        return true;
      }
    }
  }
  name = "GL_EXT_color_buffer_float";
LAB_0018a987:
  bVar1 = ContextInfo::isExtensionSupported(contextInfo,name);
  return bVar1;
}

Assistant:

bool isSizedFormatColorRenderable (const RenderContext& renderCtx, const ContextInfo& contextInfo, deUint32 sizedFormat)
{
	deUint32 renderable = 0;

	if (renderCtx.getType().getAPI() == ApiType::es(3,0))
		renderable = getRenderableBitsES3(contextInfo, sizedFormat);
	else
		throw tcu::InternalError("Context type not supported in query");

	return (renderable & RENDERABLE_COLOR) != 0;
}